

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_messagebox.cpp
# Opt level: O3

int __thiscall QtMWidgets::MessageBox::qt_metacall(MessageBox *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QDialog::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
    if (_c != InvokeMetaMethod) {
      if (_c != RegisterMethodArgumentMetaType) {
        return _id_00;
      }
      if (_id_00 < 2) {
        *(undefined8 *)*_a = 0;
      }
      goto LAB_00151ba8;
    }
    if (1 < _id_00) goto LAB_00151ba8;
    _c = InvokeMetaMethod;
  }
  qt_static_metacall((QObject *)this,_c,_id_00,_a);
LAB_00151ba8:
  return _id_00 - 2;
}

Assistant:

int QtMWidgets::MessageBox::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QDialog::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}